

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void freeregs(FuncState *fs,int r1,int r2)

{
  int iVar1;
  
  iVar1 = luaY_nvarstack(fs);
  if (r2 < r1) {
    if (iVar1 <= r1) {
      fs->freereg = fs->freereg + 0xff;
    }
    iVar1 = luaY_nvarstack(fs);
    if (r2 < iVar1) {
      return;
    }
  }
  else {
    if (iVar1 <= r2) {
      fs->freereg = fs->freereg + 0xff;
    }
    iVar1 = luaY_nvarstack(fs);
    if (r1 < iVar1) {
      return;
    }
  }
  fs->freereg = fs->freereg + 0xff;
  return;
}

Assistant:

static void freeregs (FuncState *fs, int r1, int r2) {
  if (r1 > r2) {
    freereg(fs, r1);
    freereg(fs, r2);
  }
  else {
    freereg(fs, r2);
    freereg(fs, r1);
  }
}